

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileOperation::
     Operation<long,duckdb::ReservoirQuantileState<long>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<long> *state,long *input,AggregateUnaryInput *unary_input)

{
  FunctionData *pFVar1;
  BaseReservoirSampling *this;
  
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&unary_input->input->bind_data);
  if (state->pos == 0) {
    ReservoirQuantileState<long>::Resize(state,*(idx_t *)(pFVar1 + 0x20));
  }
  if (state->r_samp == (BaseReservoirSampling *)0x0) {
    this = (BaseReservoirSampling *)operator_new(0x78);
    duckdb::BaseReservoirSampling::BaseReservoirSampling(this);
    state->r_samp = this;
  }
  ReservoirQuantileState<long>::FillReservoir(state,*(idx_t *)(pFVar1 + 0x20),*input);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &unary_input) {
		auto &bind_data = unary_input.input.bind_data->template Cast<ReservoirQuantileBindData>();
		if (state.pos == 0) {
			state.Resize(bind_data.sample_size);
		}
		if (!state.r_samp) {
			state.r_samp = new BaseReservoirSampling();
		}
		D_ASSERT(state.v);
		state.FillReservoir(bind_data.sample_size, input);
	}